

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O1

void __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::DescribeToImpl
          (UnorderedElementsAreMatcherImplBase *this,ostream *os)

{
  int iVar1;
  long *plVar2;
  ostream *poVar3;
  size_t sVar4;
  long lVar5;
  pointer *__ptr;
  char *pcVar6;
  long lVar7;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  string local_50;
  
  iVar1 = *(int *)this;
  if (iVar1 == 1) {
    pcVar6 = "a surjection from elements to requirements exists such that:\n";
  }
  else {
    if (iVar1 != 2) {
      if (iVar1 == 3) {
        lVar7 = *(long *)(this + 8);
        lVar5 = *(long *)(this + 0x10);
        if (lVar7 == lVar5) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"is empty",8);
          return;
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"has ",4);
        if (lVar5 - lVar7 == 8) {
          Elements((UnorderedElementsAreMatcherImplBase *)&local_58,1);
          Message::GetString_abi_cxx11_(&local_50,(Message *)&local_58);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (os,local_50._M_dataplus._M_p,local_50._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," and that element ",0x12);
          if (local_58._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_58._M_head_impl + 8))();
          }
          (**(code **)(*(long *)**(undefined8 **)(this + 8) + 0x10))
                    ((long *)**(undefined8 **)(this + 8),os);
          return;
        }
        Elements((UnorderedElementsAreMatcherImplBase *)&local_58,
                 *(long *)(this + 0x10) - *(long *)(this + 8) >> 3);
        Message::GetString_abi_cxx11_(&local_50,(Message *)&local_58);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,local_50._M_dataplus._M_p,local_50._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3," and there exists some permutation of elements such that:\n",0x3a);
        if (local_58._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_58._M_head_impl + 8))();
        }
      }
      goto LAB_00111bf7;
    }
    pcVar6 = "an injection from elements to requirements exists such that:\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,0x3d);
LAB_00111bf7:
  if (*(long *)(this + 0x10) != *(long *)(this + 8)) {
    pcVar6 = "";
    lVar7 = 0;
    do {
      sVar4 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,sVar4);
      if (*(int *)this == 3) {
        std::__ostream_insert<char,std::char_traits<char>>(os," - element #",0xc);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)os);
        lVar5 = 1;
        pcVar6 = " ";
      }
      else {
        lVar5 = 0xe;
        pcVar6 = " - an element ";
        poVar3 = os;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,lVar5);
      plVar2 = *(long **)(*(long *)(this + 8) + lVar7 * 8);
      (**(code **)(*plVar2 + 0x10))(plVar2,os);
      pcVar6 = "\n";
      if (*(int *)this == 3) {
        pcVar6 = ", and\n";
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != *(long *)(this + 0x10) - *(long *)(this + 8) >> 3);
  }
  return;
}

Assistant:

void UnorderedElementsAreMatcherImplBase::DescribeToImpl(
    ::std::ostream* os) const {
  switch (match_flags()) {
    case UnorderedMatcherRequire::ExactMatch:
      if (matcher_describers_.empty()) {
        *os << "is empty";
        return;
      }
      if (matcher_describers_.size() == 1) {
        *os << "has " << Elements(1) << " and that element ";
        matcher_describers_[0]->DescribeTo(os);
        return;
      }
      *os << "has " << Elements(matcher_describers_.size())
          << " and there exists some permutation of elements such that:\n";
      break;
    case UnorderedMatcherRequire::Superset:
      *os << "a surjection from elements to requirements exists such that:\n";
      break;
    case UnorderedMatcherRequire::Subset:
      *os << "an injection from elements to requirements exists such that:\n";
      break;
  }

  const char* sep = "";
  for (size_t i = 0; i != matcher_describers_.size(); ++i) {
    *os << sep;
    if (match_flags() == UnorderedMatcherRequire::ExactMatch) {
      *os << " - element #" << i << " ";
    } else {
      *os << " - an element ";
    }
    matcher_describers_[i]->DescribeTo(os);
    if (match_flags() == UnorderedMatcherRequire::ExactMatch) {
      sep = ", and\n";
    } else {
      sep = "\n";
    }
  }
}